

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O0

_Bool testbinaryfuse16pack(size_t size,size_t repeated_size)

{
  _Bool _Var1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  binary_fuse16_t filter;
  _func_size_t_void_ptr *in_stack_00000070;
  _func_void_void_ptr_char_ptr_size_t *in_stack_00000078;
  _func__Bool_void_ptr_char_ptr_size_t *in_stack_00000080;
  _func__Bool_uint64_t_ptr_uint32_t_void_ptr *in_stack_00000088;
  _func__Bool_uint64_t_void_ptr *in_stack_00000090;
  
  printf("testing binary fuse16 pack/unpack with size %zu and %zu duplicates\n",in_RDI,in_RSI);
  _Var1 = test(repeated_size,(size_t)filter.Fingerprints,(void *)filter._24_8_,
               (_func__Bool_uint32_t_void_ptr *)filter._16_8_,(_func_void_void_ptr *)filter._8_8_,
               (_func_size_t_void_ptr *)filter.Seed,in_stack_00000070,in_stack_00000078,
               in_stack_00000080,in_stack_00000088,in_stack_00000090);
  return _Var1;
}

Assistant:

bool testbinaryfuse16pack(size_t size, size_t repeated_size) {
  printf("testing binary fuse16 pack/unpack with size %zu and %zu duplicates\n", size, repeated_size);
  binary_fuse16_t filter;
  return test(size, repeated_size, &filter,
              binary_fuse16_allocate_gen,
              binary_fuse16_free_gen,
              binary_fuse16_size_in_bytes_gen,
              binary_fuse16_pack_bytes_gen,
              binary_fuse16_pack_gen,
              binary_fuse16_unpack_gen,
              binary_fuse16_populate_gen,
              binary_fuse16_contain_gen);
}